

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateMoveA
          (IMC_Generator *this,OperationType ot,shared_ptr<nigel::IM_Operator> *op)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<nigel::IM_Operator> local_110;
  shared_ptr<nigel::IM_Operator> local_100;
  shared_ptr<nigel::IM_Operator> local_f0;
  shared_ptr<nigel::IM_Operator> local_e0;
  shared_ptr<nigel::IM_Operator> local_d0;
  IM_Operator local_c0;
  shared_ptr<nigel::IM_Operator> local_a0;
  shared_ptr<nigel::IM_Operator> local_90;
  shared_ptr<nigel::IM_Operator> local_80;
  IM_Operator local_70;
  shared_ptr<nigel::IM_Operator> local_50;
  shared_ptr<nigel::IM_Operator> local_40;
  undefined1 local_30 [24];
  shared_ptr<nigel::IM_Operator> *op_local;
  IMC_Generator *pIStack_10;
  OperationType ot_local;
  IMC_Generator *this_local;
  
  local_30._16_8_ = op;
  op_local._4_4_ = ot;
  pIStack_10 = this;
  if (ot == v) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               op);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_30);
    peVar3 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    iVar1 = *(int *)&(peVar3->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_30);
    if (iVar1 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_40,op);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_50,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_40,&local_50);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_50);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_40);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)op);
      IM_Operator::as<nigel::IM_Variable>(&local_70);
      peVar3 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_70);
      iVar1 = *(int *)&(peVar3->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_70);
      if (iVar1 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_80,op);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_90,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_80,&local_90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_80);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a0,(nullptr_t)0x0);
        this_00 = &local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)this_00,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_a0,(shared_ptr<nigel::IM_Operator> *)this_00);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a0);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)op);
        IM_Operator::as<nigel::IM_Variable>(&local_c0);
        peVar3 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_c0);
        bVar2 = IM_Variable::isOnStack(peVar3);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_c0);
        if (bVar2) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_d0,op);
          generateLoadStackR0(this,&local_d0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e0,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f0,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_e0,&local_f0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e0);
        }
      }
    }
  }
  else if (ot == c) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_100,op);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_110,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_100,&local_110);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_110);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_100);
  }
  return;
}

Assistant:

void IMC_Generator::generateMoveA( OperationType ot, std::shared_ptr<IM_Operator> op )
	{
		if( ot == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( ot == OT::c )
		{
			addCmd( HexOp::mov_a_const, op );
		}
		//Ignore OT::t because it is already correct.
	}